

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_sstring_view_archive.cpp
# Opt level: O0

void __thiscall SStringViewArchive_Empty_Test::TestBody(SStringViewArchive_Empty_Test *this)

{
  bool bVar1;
  char *pcVar2;
  database_reader *archive;
  _Tuple_impl<0UL,_char,_char> in_stack_fffffffffffffe20;
  AssertHelper local_178;
  Message local_170;
  undefined1 local_168 [8];
  AssertionResult gtest_ar_1;
  database_reader local_150;
  undefined1 local_140 [8];
  shared_sstring_view actual;
  Message local_120;
  address local_118;
  address local_110;
  vector<char,_std::allocator<char>_> local_108;
  char local_ea [2];
  testing local_e8 [6];
  char local_e2 [2];
  undefined1 local_e0 [8];
  AssertionResult gtest_ar;
  typed_address<char> local_c8;
  typed_address<char> last;
  database_writer local_b8;
  value_type local_98;
  typed_address<char> local_90;
  typed_address<char> first;
  unique_lock<mock_mutex> local_78;
  undefined1 local_68 [8];
  transaction<std::unique_lock<mock_mutex>_> transaction;
  undefined1 local_28 [7];
  mock_mutex mutex;
  shared_sstring_view str;
  SStringViewArchive_Empty_Test *this_local;
  
  anon_unknown.dwarf_211f4e::SStringViewArchive::make_shared_sstring_view
            ((shared_sstring_view *)local_28,"");
  std::unique_lock<mock_mutex>::unique_lock(&local_78,(mutex_type *)&transaction.lock_.field_0xf);
  ::begin((transaction<std::unique_lock<mock_mutex>_> *)local_68,
          &(this->super_SStringViewArchive).db_,&local_78);
  std::unique_lock<mock_mutex>::~unique_lock(&local_78);
  local_98 = (value_type)
             anon_unknown.dwarf_211f4e::SStringViewArchive::current_pos
                       (&this->super_SStringViewArchive,(transaction_base *)local_68);
  pstore::typed_address<char>::typed_address(&local_90,(address)local_98);
  pstore::serialize::archive::make_writer(&local_b8,(transaction_base *)local_68);
  last.a_.a_ = pstore::serialize::
               write<pstore::serialize::archive::database_writer,pstore::sstring_view<std::shared_ptr<char_const>>>
                         (&local_b8,(sstring_view<std::shared_ptr<const_char>_> *)local_28);
  pstore::serialize::archive::database_writer::~database_writer(&local_b8);
  gtest_ar.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )anon_unknown.dwarf_211f4e::SStringViewArchive::current_pos
                   (&this->super_SStringViewArchive,(transaction_base *)local_68);
  pstore::typed_address<char>::typed_address
            (&local_c8,
             (address)gtest_ar.message_._M_t.
                      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      .
                      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                      ._M_head_impl);
  local_ea[1] = 1;
  local_ea[0] = '\0';
  testing::ElementsAre<char,char>(local_e8,local_ea + 1,local_ea);
  testing::internal::
  MakePredicateFormatterFromMatcher<testing::internal::ElementsAreMatcher<std::tuple<char,char>>>
            ((ElementsAreMatcher<std::tuple<char,_char>_>)in_stack_fffffffffffffe20);
  local_110 = local_90.a_.a_;
  local_118 = local_c8.a_.a_;
  anon_unknown.dwarf_211f4e::SStringViewArchive::as_vector
            (&local_108,&this->super_SStringViewArchive,local_90,local_c8);
  testing::internal::
  PredicateFormatterFromMatcher<testing::internal::ElementsAreMatcher<std::tuple<char,char>>>::
  operator()(local_e0,local_e2,(vector<char,_std::allocator<char>_> *)"as_vector (first, last)");
  std::vector<char,_std::allocator<char>_>::~vector(&local_108);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_e0);
  if (!bVar1) {
    testing::Message::Message(&local_120);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_e0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&actual.size_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/core/test_sstring_view_archive.cpp"
               ,0x66,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&actual.size_,&local_120);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&actual.size_);
    testing::Message::~Message(&local_120);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_e0);
  gtest_ar_1.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )pstore::typed_address<char>::to_address(&local_90);
  pstore::serialize::archive::database_reader::database_reader
            (&local_150,&(this->super_SStringViewArchive).db_,
             (address)gtest_ar_1.message_._M_t.
                      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      .
                      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                      ._M_head_impl);
  pstore::serialize::
  read<pstore::sstring_view<std::shared_ptr<char_const>>,pstore::serialize::archive::database_reader>
            ((sstring_view<std::shared_ptr<const_char>_> *)local_140,(serialize *)&local_150,archive
            );
  testing::internal::EqHelper::
  Compare<pstore::sstring_view<std::shared_ptr<const_char>_>,_char[1],_nullptr>
            ((EqHelper *)local_168,"actual","\"\"",
             (sstring_view<std::shared_ptr<const_char>_> *)local_140,(char (*) [1])0x30501e);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_168);
  if (!bVar1) {
    testing::Message::Message(&local_170);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_168);
    testing::internal::AssertHelper::AssertHelper
              (&local_178,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/core/test_sstring_view_archive.cpp"
               ,0x6d,pcVar2);
    testing::internal::AssertHelper::operator=(&local_178,&local_170);
    testing::internal::AssertHelper::~AssertHelper(&local_178);
    testing::Message::~Message(&local_170);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_168);
  pstore::sstring_view<std::shared_ptr<const_char>_>::~sstring_view
            ((sstring_view<std::shared_ptr<const_char>_> *)local_140);
  pstore::transaction<std::unique_lock<mock_mutex>_>::~transaction
            ((transaction<std::unique_lock<mock_mutex>_> *)local_68);
  pstore::sstring_view<std::shared_ptr<const_char>_>::~sstring_view
            ((sstring_view<std::shared_ptr<const_char>_> *)local_28);
  return;
}

Assistant:

TEST_F (SStringViewArchive, Empty) {
    auto str = make_shared_sstring_view ("");

    // Append 'str'' to the store (we don't need to have committed the transaction to be able to
    // access its contents).
    mock_mutex mutex;
    auto transaction = begin (db_, std::unique_lock<mock_mutex>{mutex});
    auto const first = pstore::typed_address<char> (this->current_pos (transaction));
    pstore::serialize::write (pstore::serialize::archive::make_writer (transaction), str);

    auto const last = pstore::typed_address<char> (this->current_pos (transaction));
    EXPECT_THAT (as_vector (first, last), ::testing::ElementsAre ('\x1', '\x0'));

    // Now try reading it back and compare to the original string.
    {
        using namespace pstore::serialize;
        shared_sstring_view const actual =
            read<shared_sstring_view> (archive::database_reader{db_, first.to_address ()});
        EXPECT_EQ (actual, "");
    }
}